

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall BpTree<float>::DeleteKey(BpTree<float> *this,float k,Addr p)

{
  Addr p_00;
  IndexNode<float> C;
  IndexNode<float> local_80;
  
  p_00 = FindLeafAddr(this,k,p);
  if ((ulong)p_00 < 0xffffffff00000000) {
    IndexNode<float>::IndexNode(&local_80,this->N);
    FindNode(this,p_00,&local_80);
    Delete_Aux(this,&local_80,k,p);
    IndexNode<float>::~IndexNode(&local_80);
  }
  return;
}

Assistant:

void BpTree<K>::DeleteKey(K k, Addr p) {
	Addr pos = this->FindLeafAddr(k, p);
	if (pos.FileOff != -1) {
		IndexNode<K> C(N);
		this->FindNode(pos, C);
		this->Delete_Aux(C, k, p);
	}
	else
		//cout << "Cannot find the key!" << endl;
	return;
}